

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopFocusScope(void)

{
  ImGuiWindow *pIVar1;
  uint *puVar2;
  ImVector<unsigned_int> *this;
  
  if (0 < (GImGui->FocusScopeStack).Size) {
    pIVar1 = GImGui->CurrentWindow;
    this = &GImGui->FocusScopeStack;
    puVar2 = ImVector<unsigned_int>::back(this);
    (pIVar1->DC).NavFocusScopeIdCurrent = *puVar2;
    ImVector<unsigned_int>::pop_back(this);
    return;
  }
  __assert_fail("g.FocusScopeStack.Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1b45,"void ImGui::PopFocusScope()");
}

Assistant:

void ImGui::PopFocusScope()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.FocusScopeStack.Size > 0); // Too many PopFocusScope() ?
    window->DC.NavFocusScopeIdCurrent = g.FocusScopeStack.back();
    g.FocusScopeStack.pop_back();
}